

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::ScrollArea::ScrollArea(ScrollArea *this,QWidget *parent)

{
  ScrollAreaPrivate *pSVar1;
  ScrollAreaPrivate *d;
  QWidget *parent_local;
  ScrollArea *this_local;
  
  *(undefined ***)&this->super_AbstractScrollArea = &PTR_metaObject_00233ab0;
  *(undefined ***)&(this->super_AbstractScrollArea).field_0x10 = &PTR__ScrollArea_00233c78;
  pSVar1 = (ScrollAreaPrivate *)operator_new(0xc0);
  ScrollAreaPrivate::ScrollAreaPrivate(pSVar1,this);
  AbstractScrollArea::AbstractScrollArea
            (&this->super_AbstractScrollArea,(AbstractScrollAreaPrivate *)pSVar1,parent);
  *(undefined ***)&this->super_AbstractScrollArea = &PTR_metaObject_00233ab0;
  *(undefined ***)&(this->super_AbstractScrollArea).field_0x10 = &PTR__ScrollArea_00233c78;
  pSVar1 = d_func(this);
  QWidget::setBackgroundRole((ColorRole)(pSVar1->super_AbstractScrollAreaPrivate).viewport);
  return;
}

Assistant:

ScrollArea::ScrollArea( QWidget * parent )
	:	AbstractScrollArea( new ScrollAreaPrivate( this ), parent )
{
	ScrollAreaPrivate * d = d_func();
	d->viewport->setBackgroundRole( QPalette::NoRole );
}